

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardsurface.h
# Opt level: O2

void __thiscall rengine::StandardSurface::~StandardSurface(StandardSurface *this)

{
  Renderer *pRVar1;
  Node *pNVar2;
  
  (this->super_Surface)._vptr_Surface = (_func_int **)&PTR__StandardSurface_0012e8c8;
  pRVar1 = (this->m_renderer)._M_t.
           super___uniq_ptr_impl<rengine::Renderer,_std::default_delete<rengine::Renderer>_>._M_t.
           super__Tuple_impl<0UL,_rengine::Renderer_*,_std::default_delete<rengine::Renderer>_>.
           super__Head_base<0UL,_rengine::Renderer_*,_false>._M_head_impl;
  if ((pRVar1 != (Renderer *)0x0) && (pNVar2 = pRVar1->m_sceneRoot, pNVar2 != (Node *)0x0)) {
    (**(code **)((long)(pNVar2->super_SignalEmitter)._vptr_SignalEmitter + 0x10))();
  }
  WorkQueue::~WorkQueue(&this->m_workQueue);
  AnimationManager::~AnimationManager(&this->m_animationManager);
  std::unique_ptr<rengine::Renderer,_std::default_delete<rengine::Renderer>_>::~unique_ptr
            (&this->m_renderer);
  Surface::~Surface(&this->super_Surface);
  return;
}

Assistant:

~StandardSurface()
    {
        if (m_renderer) {
            if (m_renderer->sceneRoot())
                m_renderer->sceneRoot()->destroy();
        }
    }